

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_base.hpp
# Opt level: O3

size_t jessilib::encode_codepoint_utf8<char8_t,char8_t*>
                 (char8_t **out_destination,char32_t in_codepoint)

{
  size_t sVar1;
  byte *pbVar2;
  byte bVar3;
  
  if (0x10ffff < (uint)in_codepoint) {
    return 0;
  }
  bVar3 = (byte)in_codepoint;
  if ((uint)in_codepoint < 0x80) {
    pbVar2 = (byte *)*out_destination;
    *pbVar2 = bVar3;
    pbVar2 = pbVar2 + 1;
    sVar1 = 1;
  }
  else if ((uint)in_codepoint < 0x800) {
    pbVar2 = (byte *)*out_destination;
    *pbVar2 = (byte)((uint)in_codepoint >> 6) | 0xc0;
    pbVar2[1] = bVar3 & 0x3f | 0x80;
    pbVar2 = pbVar2 + 2;
    sVar1 = 2;
  }
  else {
    pbVar2 = (byte *)*out_destination;
    if ((uint)in_codepoint < 0x10000) {
      *pbVar2 = (byte)((uint)in_codepoint >> 0xc) | 0xe0;
      pbVar2[1] = (byte)((uint)in_codepoint >> 6) & 0x3f | 0x80;
      pbVar2[2] = bVar3 & 0x3f | 0x80;
      pbVar2 = pbVar2 + 3;
      sVar1 = 3;
    }
    else {
      *pbVar2 = (byte)((uint)in_codepoint >> 0x12) | 0xf0;
      pbVar2[1] = (byte)((uint)in_codepoint >> 0xc) & 0x3f | 0x80;
      pbVar2[2] = (byte)((uint)in_codepoint >> 6) & 0x3f | 0x80;
      pbVar2[3] = bVar3 & 0x3f | 0x80;
      pbVar2 = pbVar2 + 4;
      sVar1 = 4;
    }
  }
  *out_destination = (char8_t *)pbVar2;
  return sVar1;
}

Assistant:

constexpr size_t encode_codepoint_utf8(T& out_destination, char32_t in_codepoint) {
	if (in_codepoint > 0x10FFFF) {
		return 0;
	}

	if (in_codepoint <= 0x007F) {
		// 1-byte sequence (7 bits)
		impl_unicode::append_helper(out_destination, static_cast<CharT>(in_codepoint));
		return 1;
	}

	if (in_codepoint <= 0x07FF) {
		// 2-byte sequence (11 bits; 5 + 6)
		impl_unicode::append_helper(out_destination, static_cast<CharT>(0xC0 | ((in_codepoint >> 6) & 0x1F)));
		impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | (in_codepoint & 0x3F)));
		return 2;
	}

	if (in_codepoint <= 0xFFFF) {
		// 3-byte sequence (16 bits; 4 + 6 + 6)
		impl_unicode::append_helper(out_destination, static_cast<CharT>(0xE0 | ((in_codepoint >> 12) & 0x0F)));
		impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | ((in_codepoint >> 6) & 0x3F)));
		impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | (in_codepoint & 0x3F)));
		return 3;
	}

	// 4-byte sequence (21 bits; 3 + 6 + 6 + 6)
	impl_unicode::append_helper(out_destination, static_cast<CharT>(0xF0 | ((in_codepoint >> 18) & 0x07)));
	impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | ((in_codepoint >> 12) & 0x3F)));
	impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | ((in_codepoint >> 6) & 0x3F)));
	impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | (in_codepoint & 0x3F)));
	return 4;
}